

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Append(PosixWritableFile *this,Slice *data)

{
  long lVar1;
  size_t __n;
  bool bVar2;
  size_t sVar3;
  char *__src;
  unsigned_long *puVar4;
  ulong __n_00;
  long in_RSI;
  PosixWritableFile *in_RDI;
  long in_FS_OFFSET;
  size_t copy_size;
  char *write_data;
  Status status;
  size_t write_size;
  Slice *in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = Slice::size(in_stack_ffffffffffffff78);
  __src = Slice::data(in_stack_ffffffffffffff78);
  puVar4 = std::min<unsigned_long>
                     (in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78);
  __n = *puVar4;
  memcpy((void *)(in_RSI + 8 + *(long *)(in_RSI + 0x10008)),__src,__n);
  __n_00 = sVar3 - __n;
  *(size_t *)(in_RSI + 0x10008) = __n + *(long *)(in_RSI + 0x10008);
  if (__n_00 == 0) {
    Status::OK();
  }
  else {
    FlushBuffer(in_RDI);
    bVar2 = Status::ok((Status *)in_stack_ffffffffffffff78);
    if (bVar2) {
      if (__n_00 < 0x10000) {
        memcpy((void *)(in_RSI + 8),__src + __n,__n_00);
        *(ulong *)(in_RSI + 0x10008) = __n_00;
        Status::OK();
      }
      else {
        WriteUnbuffered((PosixWritableFile *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      }
    }
    else {
      Status::Status((Status *)in_stack_ffffffffffffff78,(Status *)0xd5402e);
    }
    Status::~Status((Status *)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Append(const Slice& data) override {
    size_t write_size = data.size();
    const char* write_data = data.data();

    // Fit as much as possible into buffer.
    size_t copy_size = std::min(write_size, kWritableFileBufferSize - pos_);
    std::memcpy(buf_ + pos_, write_data, copy_size);
    write_data += copy_size;
    write_size -= copy_size;
    pos_ += copy_size;
    if (write_size == 0) {
      return Status::OK();
    }

    // Can't fit in buffer, so need to do at least one write.
    Status status = FlushBuffer();
    if (!status.ok()) {
      return status;
    }

    // Small writes go to buffer, large writes are written directly.
    if (write_size < kWritableFileBufferSize) {
      std::memcpy(buf_, write_data, write_size);
      pos_ = write_size;
      return Status::OK();
    }
    return WriteUnbuffered(write_data, write_size);
  }